

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeAllEqualityTerms
              (Parse *pParse,WhereLevel *pLevel,WhereClause *pWC,Bitmask notReady,int nExtraReg,
              char **pzAff)

{
  ushort uVar1;
  int iCur_00;
  Vdbe *v_00;
  Index *pIdx_00;
  sqlite3 *db;
  Expr *pExpr;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  WhereTerm *pTerm_00;
  Expr *pRight;
  int k;
  int r1;
  char *zAff;
  int local_68;
  int nReg;
  int regBase;
  int j;
  WhereTerm *pTerm;
  int iCur;
  Index *pIdx;
  Vdbe *v;
  int nEq;
  char **pzAff_local;
  int nExtraReg_local;
  Bitmask notReady_local;
  WhereClause *pWC_local;
  WhereLevel *pLevel_local;
  Parse *pParse_local;
  
  uVar1 = (pLevel->plan).nEq;
  v_00 = pParse->pVdbe;
  iCur_00 = pLevel->iTabCur;
  pIdx_00 = (pLevel->plan).u.pIdx;
  local_68 = pParse->nMem + 1;
  iVar3 = (uint)(pLevel->plan).nEq + nExtraReg;
  pParse->nMem = iVar3 + pParse->nMem;
  db = pParse->db;
  pcVar5 = sqlite3IndexAffinityStr(v_00,pIdx_00);
  pcVar5 = sqlite3DbStrDup(db,pcVar5);
  if (pcVar5 == (char *)0x0) {
    pParse->db->mallocFailed = '\x01';
  }
  nReg = 0;
  while ((nReg < (int)(uint)uVar1 &&
         (pTerm_00 = findTerm(pWC,iCur_00,pIdx_00->aiColumn[nReg],notReady,(pLevel->plan).wsFlags,
                              pIdx_00), pTerm_00 != (WhereTerm *)0x0))) {
    iVar4 = codeEqualityTerm(pParse,pTerm_00,pLevel,nReg,local_68 + nReg);
    if (iVar4 != local_68 + nReg) {
      if (iVar3 == 1) {
        sqlite3ReleaseTempReg(pParse,local_68);
        local_68 = iVar4;
      }
      else {
        sqlite3VdbeAddOp2(v_00,0xf,iVar4,local_68 + nReg);
      }
    }
    if ((pTerm_00->eOperator & 0x81) == 0) {
      pExpr = pTerm_00->pExpr->pRight;
      sqlite3ExprCodeIsNullJump(v_00,pExpr,local_68 + nReg,pLevel->addrBrk);
      if (pcVar5 != (char *)0x0) {
        cVar2 = sqlite3CompareAffinity(pExpr,pcVar5[nReg]);
        if (cVar2 == 'b') {
          pcVar5[nReg] = 'b';
        }
        iVar4 = sqlite3ExprNeedsNoAffinityChange(pExpr,pcVar5[nReg]);
        if (iVar4 != 0) {
          pcVar5[nReg] = 'b';
        }
      }
    }
    nReg = nReg + 1;
  }
  *pzAff = pcVar5;
  return local_68;
}

Assistant:

static int codeAllEqualityTerms(
  Parse *pParse,        /* Parsing context */
  WhereLevel *pLevel,   /* Which nested loop of the FROM we are coding */
  WhereClause *pWC,     /* The WHERE clause */
  Bitmask notReady,     /* Which parts of FROM have not yet been coded */
  int nExtraReg,        /* Number of extra registers to allocate */
  char **pzAff          /* OUT: Set to point to affinity string */
){
  int nEq = pLevel->plan.nEq;   /* The number of == or IN constraints to code */
  Vdbe *v = pParse->pVdbe;      /* The vm under construction */
  Index *pIdx;                  /* The index being used for this loop */
  int iCur = pLevel->iTabCur;   /* The cursor of the table */
  WhereTerm *pTerm;             /* A single constraint term */
  int j;                        /* Loop counter */
  int regBase;                  /* Base register */
  int nReg;                     /* Number of registers to allocate */
  char *zAff;                   /* Affinity string to return */

  /* This module is only called on query plans that use an index. */
  assert( pLevel->plan.wsFlags & WHERE_INDEXED );
  pIdx = pLevel->plan.u.pIdx;

  /* Figure out how many memory cells we will need then allocate them.
  */
  regBase = pParse->nMem + 1;
  nReg = pLevel->plan.nEq + nExtraReg;
  pParse->nMem += nReg;

  zAff = sqlite3DbStrDup(pParse->db, sqlite3IndexAffinityStr(v, pIdx));
  if( !zAff ){
    pParse->db->mallocFailed = 1;
  }

  /* Evaluate the equality constraints
  */
  assert( pIdx->nColumn>=nEq );
  for(j=0; j<nEq; j++){
    int r1;
    int k = pIdx->aiColumn[j];
    pTerm = findTerm(pWC, iCur, k, notReady, pLevel->plan.wsFlags, pIdx);
    if( pTerm==0 ) break;
    /* The following true for indices with redundant columns. 
    ** Ex: CREATE INDEX i1 ON t1(a,b,a); SELECT * FROM t1 WHERE a=0 AND b=0; */
    testcase( (pTerm->wtFlags & TERM_CODED)!=0 );
    testcase( pTerm->wtFlags & TERM_VIRTUAL ); /* EV: R-30575-11662 */
    r1 = codeEqualityTerm(pParse, pTerm, pLevel, j, regBase+j);
    if( r1!=regBase+j ){
      if( nReg==1 ){
        sqlite3ReleaseTempReg(pParse, regBase);
        regBase = r1;
      }else{
        sqlite3VdbeAddOp2(v, OP_SCopy, r1, regBase+j);
      }
    }
    testcase( pTerm->eOperator & WO_ISNULL );
    testcase( pTerm->eOperator & WO_IN );
    if( (pTerm->eOperator & (WO_ISNULL|WO_IN))==0 ){
      Expr *pRight = pTerm->pExpr->pRight;
      sqlite3ExprCodeIsNullJump(v, pRight, regBase+j, pLevel->addrBrk);
      if( zAff ){
        if( sqlite3CompareAffinity(pRight, zAff[j])==SQLITE_AFF_NONE ){
          zAff[j] = SQLITE_AFF_NONE;
        }
        if( sqlite3ExprNeedsNoAffinityChange(pRight, zAff[j]) ){
          zAff[j] = SQLITE_AFF_NONE;
        }
      }
    }
  }
  *pzAff = zAff;
  return regBase;
}